

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

Ignored __thiscall
re2::NamedCapturesWalker::PreVisit(NamedCapturesWalker *this,Regexp *re,Ignored ignored,bool *stop)

{
  _Rb_tree_header *p_Var1;
  mapped_type mVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *pmVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  
  if ((re->op_ == '\v') && ((re->field_7).field_1.name_ != (string *)0x0)) {
    if (this->map_ ==
        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)0x0) {
      pmVar3 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)operator_new(0x30);
      p_Var1 = &(pmVar3->_M_t)._M_impl.super__Rb_tree_header;
      (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      this->map_ = pmVar3;
    }
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&this->map_->_M_t,(re->field_7).field_1.name_);
    if ((_Rb_tree_header *)iVar4._M_node == &(this->map_->_M_t)._M_impl.super__Rb_tree_header) {
      if (re->op_ != '\v') {
        __assert_fail("(op_) == (kRegexpCapture)",
                      "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.h"
                      ,0x14b,"int re2::Regexp::cap()");
      }
      mVar2 = (re->field_7).field_0.max_;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](this->map_,(re->field_7).field_1.name_);
      *pmVar5 = mVar2;
    }
  }
  return ignored;
}

Assistant:

Ignored PreVisit(Regexp* re, Ignored ignored, bool* stop) {
    if (re->op() == kRegexpCapture && re->name() != NULL) {
      // Allocate map once we find a name.
      if (map_ == NULL)
        map_ = new map<string, int>;

      // Record first occurrence of each name.
      // (The rule is that if you have the same name
      // multiple times, only the leftmost one counts.)
      if (map_->find(*re->name()) == map_->end())
        (*map_)[*re->name()] = re->cap();
    }
    return ignored;
  }